

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O0

Task * __thiscall
LinkedListPool<depspawn::internal::TaskPool::Task,false,false>::
malloc<depspawn::internal::TaskPool*,depspawn::internal::Workitem*&,std::_Bind<std::function<void(int&)>(std::reference_wrapper<int>)>>
          (LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *this,TaskPool **args,
          Workitem **args_1,_Bind<std::function<void_(int_&)>_(std::reference_wrapper<int>)> *args_2
          )

{
  Task *f;
  Workitem *in_RCX;
  TaskPool *in_RDX;
  LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false> *in_RSI;
  Task *ret;
  
  f = LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::intl_malloc(in_RSI);
  depspawn::internal::TaskPool::Task::
  Task<std::_Bind<std::function<void(int&)>(std::reference_wrapper<int>)>>
            ((Task *)in_RSI,in_RDX,in_RCX,
             (_Bind<std::function<void_(int_&)>_(std::reference_wrapper<int>)> *)f);
  return f;
}

Assistant:

T* malloc(Args&&... args)
   {
     T * const ret = this->intl_malloc();
     new (ret) T(std::forward<Args>(args)...);
     return ret;
   }